

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpCodeUtil.cpp
# Opt level: O3

char16 * Js::OpCodeUtil::GetOpCodeName(OpCode op)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  undefined6 in_register_0000003a;
  uint uVar4;
  undefined8 *puVar5;
  
  uVar4 = (uint)op;
  if ((uint)CONCAT62(in_register_0000003a,op) < 0x100) {
    puVar5 = (undefined8 *)(OpCodeNames + (ulong)op * 8);
  }
  else if (uVar4 < 0x189) {
    puVar5 = (undefined8 *)(ExtendedOpCodeNames + (ulong)(uVar4 - 0x100) * 8);
  }
  else {
    if (0x328 < uVar4 - 0x18a) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/OpCodeUtil.cpp"
                                  ,0xde,
                                  "(opIndex < (sizeof(*__countof_helper(BackendOpCodeNames)) + 0))",
                                  "opIndex < _countof(BackendOpCodeNames)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    puVar5 = (undefined8 *)(BackendOpCodeNames + (ulong)(uVar4 - 0x18a) * 8);
  }
  return (char16 *)*puVar5;
}

Assistant:

char16 const * OpCodeUtil::GetOpCodeName(OpCode op)
    {
        if (op <= Js::OpCode::MaxByteSizedOpcodes)
        {
            Assert((uint)op < _countof(OpCodeNames));
            __analysis_assume((uint)op < _countof(OpCodeNames));
            return OpCodeNames[(uint)op];
        }
        else if (op < Js::OpCode::ByteCodeLast)
        {
            uint opIndex = op - (Js::OpCode::MaxByteSizedOpcodes + 1);
            Assert(opIndex < _countof(ExtendedOpCodeNames));
            __analysis_assume(opIndex < _countof(ExtendedOpCodeNames));
            return ExtendedOpCodeNames[opIndex];
        }
        uint opIndex = op - (Js::OpCode::ByteCodeLast + 1);
        Assert(opIndex < _countof(BackendOpCodeNames));
        __analysis_assume(opIndex < _countof(BackendOpCodeNames));
        return BackendOpCodeNames[opIndex];
    }